

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O3

void pg::set_in_CALL(WorkerP *w,Task *__dq_head,int arg_1,int arg_2)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  Worker *pWVar3;
  int arg_2_00;
  ulong uVar4;
  long lVar5;
  long lVar6;
  TD_set_in *t;
  uint uVar7;
  long lVar8;
  
  uVar4 = (ulong)(uint)arg_2;
  if (0x40 < arg_2) {
    do {
      if (w->end == __dq_head) {
        lace_abort_stack_overflow();
      }
      __dq_head->f = set_in_WRAP;
      (__dq_head->thief)._M_b._M_p = (__pointer_type)0x1;
      arg_2_00 = (int)(uVar4 >> 1);
      *(int *)__dq_head->d = arg_2_00 + arg_1;
      *(int *)(__dq_head->d + 4) = (int)uVar4 - arg_2_00;
      pWVar3 = w->_public;
      if (w->allstolen == '\0') {
        if (pWVar3->movesplit != '\0') {
          uVar7 = (uint)((int)((ulong)((long)__dq_head - (long)w->dq) >> 6) + 2 +
                        (int)((ulong)((long)w->split - (long)w->dq) >> 6)) >> 1;
          LOCK();
          *(uint *)((long)&pWVar3->ts + 4) = uVar7;
          UNLOCK();
          w->split = w->dq + uVar7;
          pWVar3->movesplit = '\0';
        }
      }
      else {
        if (pWVar3->movesplit != '\0') {
          pWVar3->movesplit = '\0';
        }
        uVar4 = (long)__dq_head - (long)w->dq;
        LOCK();
        pWVar3->ts = (TailSplit)
                     ((uVar4 >> 6 & 0xffffffff | (uVar4 & 0xffffffffffffffc0) << 0x1a) + 0x100000000
                     );
        UNLOCK();
        pWVar3->allstolen = '\0';
        w->split = __dq_head + 1;
        w->allstolen = '\0';
      }
      set_in_CALL(w,__dq_head + 1,arg_1,arg_2_00);
      if ((w->_public->movesplit != '\0') || (__dq_head < w->split)) {
        set_in_SYNC_SLOW(w,__dq_head);
        return;
      }
      (__dq_head->thief)._M_b._M_p = (__pointer_type)0x0;
      arg_1 = *(int *)__dq_head->d;
      arg_2 = *(int *)(__dq_head->d + 4);
      uVar4 = (ulong)(uint)arg_2;
    } while (0x40 < arg_2);
  }
  if (0 < arg_2) {
    lVar5 = (long)arg_1;
    uVar4 = (ulong)(uint)arg_2;
    lVar6 = done;
    do {
      if (((*(int *)(lVar6 + lVar5 * 4) != 3) &&
          (lVar8 = (long)*(int *)(str + lVar5 * 4), lVar8 != -1)) &&
         (*(int *)(halt + lVar8 * 4) == 0)) {
        LOCK();
        puVar1 = (undefined4 *)(first_in + lVar8 * 4);
        uVar2 = *puVar1;
        *puVar1 = (int)lVar5;
        UNLOCK();
        *(undefined4 *)(next_in + lVar5 * 4) = uVar2;
        lVar6 = done;
      }
      lVar5 = lVar5 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

VOID_TASK_2(set_in, int, begin, int, count)
{
    // some cut-off point...
    if (count <= 64) {
        for (int i=0; i<count; i++) {
            int n = begin+i;
            if (done[n] != 3) {
                int s = str[n];
                if (s != -1 and !halt[s]) {
                    // atomically set first_in[s] to n, and return the previous value
                    next_in[n] = __sync_lock_test_and_set(first_in+s, n);
                }
            }
        }
    } else {
        SPAWN(set_in, begin+count/2, count-count/2);
        CALL(set_in, begin, count/2);
        SYNC(set_in);
    }
}